

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O2

bool operator==(CService *a,CService *b)

{
  uint16_t uVar1;
  uint16_t uVar2;
  bool bVar3;
  long in_FS_OFFSET;
  CNetAddr local_60;
  CNetAddr local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  CNetAddr::CNetAddr(&local_40,&a->super_CNetAddr);
  CNetAddr::CNetAddr(&local_60,&b->super_CNetAddr);
  bVar3 = operator==(&local_40,&local_60);
  uVar1 = b->port;
  uVar2 = a->port;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_60.m_addr);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_40.m_addr);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar3 && uVar2 == uVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool operator==(const CService& a, const CService& b)
{
    return static_cast<CNetAddr>(a) == static_cast<CNetAddr>(b) && a.port == b.port;
}